

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.c
# Opt level: O1

SqQueue InitQueue2(SqQueue Q)

{
  undefined8 uVar1;
  SqQueue SVar2;
  
  uVar1 = Q._8_8_;
  SVar2.base = (ElementType *)malloc(400);
  if (SVar2.base == (ElementType *)0x0) {
    uVar1 = 0;
    printf(anon_var_dwarf_27);
  }
  printf(anon_var_dwarf_88);
  SVar2.front = (int)uVar1;
  SVar2.rear = (int)((ulong)uVar1 >> 0x20);
  return SVar2;
}

Assistant:

SqQueue InitQueue2(SqQueue Q){
    Q.base = (ElementType *)malloc(MAXQSIZE * sizeof(ElementType));
    if(!Q.base){
        printf("储存分配失败");
        Q.front = Q.rear = 0;
    }
    printf("构建循环队列成功");
    return Q;
}